

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_dist_wtd_comp_weight_assign
               (AV1_COMMON *cm,MB_MODE_INFO *mbmi,int *fwd_offset,int *bck_offset,
               int *use_dist_wtd_comp_avg,int is_compound)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  RefCntBuffer *pRVar6;
  RefCntBuffer *pRVar7;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  int in_R9D;
  int d1_c1;
  int d0_c0;
  int c1;
  int c0;
  int i;
  int order;
  int d1;
  int d0;
  int fwd_frame_index;
  int bck_frame_index;
  int cur_frame_index;
  RefCntBuffer *fwd_buf;
  RefCntBuffer *bck_buf;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_5c;
  uint local_4c;
  uint local_48;
  
  if ((in_R9D == 0) || (((byte)((ushort)*(undefined2 *)(in_RSI + 0xa7) >> 9) & 1) != 0)) {
    *in_RDX = 8;
    *in_RCX = 8;
    *in_R8 = 0;
  }
  else {
    *in_R8 = 1;
    pRVar6 = get_ref_frame_buf((AV1_COMMON *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff8f);
    pRVar7 = get_ref_frame_buf((AV1_COMMON *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff8f);
    iVar2 = *(int *)(*(long *)(in_RDI + 0xe8) + 4);
    local_48 = 0;
    local_4c = 0;
    if (pRVar6 != (RefCntBuffer *)0x0) {
      local_48 = pRVar6->order_hint;
    }
    if (pRVar7 != (RefCntBuffer *)0x0) {
      local_4c = pRVar7->order_hint;
    }
    iVar1 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28),local_4c,iVar2);
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    iVar1 = clamp(iVar1,0,0x1f);
    iVar2 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28),iVar2,local_48);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    iVar2 = clamp(iVar2,0,0x1f);
    uVar3 = (uint)(iVar1 <= iVar2);
    if ((iVar1 == 0) || (iVar2 == 0)) {
      *in_RDX = quant_dist_lookup_table[3][(int)uVar3];
      *in_RCX = quant_dist_lookup_table[3][(int)(1 - uVar3)];
    }
    else {
      for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
        iVar4 = iVar1 * quant_dist_weight[local_5c][(int)uVar3];
        iVar5 = iVar2 * quant_dist_weight[local_5c][(int)(uint)((uVar3 != 0 ^ 0xffU) & 1)];
        if (((iVar2 < iVar1) && (iVar4 < iVar5)) || ((iVar1 <= iVar2 && (iVar5 < iVar4)))) break;
      }
      *in_RDX = quant_dist_lookup_table[local_5c][(int)uVar3];
      *in_RCX = quant_dist_lookup_table[local_5c][(int)(1 - uVar3)];
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_comp_weight_assign(const AV1_COMMON *cm,
                                     const MB_MODE_INFO *mbmi, int *fwd_offset,
                                     int *bck_offset,
                                     int *use_dist_wtd_comp_avg,
                                     int is_compound) {
  assert(fwd_offset != NULL && bck_offset != NULL);
  if (!is_compound || mbmi->compound_idx) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
    return;
  }

  *use_dist_wtd_comp_avg = 1;
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  const int cur_frame_index = cm->cur_frame->order_hint;
  int bck_frame_index = 0, fwd_frame_index = 0;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int d0 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       fwd_frame_index, cur_frame_index)),
                 0, MAX_FRAME_DISTANCE);
  int d1 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       cur_frame_index, bck_frame_index)),
                 0, MAX_FRAME_DISTANCE);

  const int order = d0 <= d1;

  if (d0 == 0 || d1 == 0) {
    *fwd_offset = quant_dist_lookup_table[3][order];
    *bck_offset = quant_dist_lookup_table[3][1 - order];
    return;
  }

  int i;
  for (i = 0; i < 3; ++i) {
    int c0 = quant_dist_weight[i][order];
    int c1 = quant_dist_weight[i][!order];
    int d0_c0 = d0 * c0;
    int d1_c1 = d1 * c1;
    if ((d0 > d1 && d0_c0 < d1_c1) || (d0 <= d1 && d0_c0 > d1_c1)) break;
  }

  *fwd_offset = quant_dist_lookup_table[i][order];
  *bck_offset = quant_dist_lookup_table[i][1 - order];
}